

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  undefined8 this_00;
  XmlWriter *this_01;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  StreamingReporterBase<Catch::XmlReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testRunStats);
  std::__cxx11::string::string(local_38,"OverallResults",&local_a9);
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_01,(XmlFormatting)local_38);
  std::__cxx11::string::string((string *)&local_58,"successes",&local_aa);
  this_00 = local_a8._0_8_;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a8._0_8_,&local_58,&(testRunStats->totals).assertions.passed);
  std::__cxx11::string::string((string *)&local_78,"failures",&local_ab);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,&local_78,&(testRunStats->totals).assertions.failed);
  std::__cxx11::string::string((string *)(local_a8 + 0x10),"expectedFailures",&local_ac);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,(string *)(local_a8 + 0x10),
             &(testRunStats->totals).assertions.failedButOk);
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string(local_38,"OverallResultsCases",&local_a9);
  XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_01,(XmlFormatting)local_38);
  std::__cxx11::string::string((string *)&local_58,"successes",&local_aa);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a8._0_8_,&local_58,&(testRunStats->totals).testCases.passed);
  std::__cxx11::string::string((string *)&local_78,"failures",&local_ab);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a8._0_8_,&local_78,&(testRunStats->totals).testCases.failed);
  std::__cxx11::string::string((string *)(local_a8 + 0x10),"expectedFailures",&local_ac);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a8._0_8_,(string *)(local_a8 + 0x10),
             &(testRunStats->totals).testCases.failedButOk);
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
  std::__cxx11::string::~string(local_38);
  XmlWriter::endElement(this_01,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testRunStats.totals.assertions.passed )
            .writeAttribute( "failures", testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testRunStats.totals.testCases.passed )
            .writeAttribute( "failures", testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }